

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

void __thiscall
despot::Logger::Logger
          (Logger *this,DSPOMDP *model,Belief *belief,Solver *solver,World *world,string *world_type
          ,clock_t start_clockt,ostream *out,double target_finish_time,int num_steps)

{
  double dVar1;
  int iVar2;
  undefined4 extraout_var;
  
  this->_vptr_Logger = (_func_int **)&PTR__Logger_0019b710;
  this->model_ = model;
  this->world_ = world;
  this->belief_ = belief;
  this->start_clockt_ = start_clockt;
  std::__cxx11::string::string((string *)&this->world_type_,(string *)world_type);
  this->step_ = 0;
  this->out_ = out;
  (this->discounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->discounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->discounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->undiscounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->undiscounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->undiscounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->reward_ = 0.0;
  this->total_discounted_reward_ = 0.0;
  this->total_undiscounted_reward_ = 0.0;
  iVar2 = (*world->_vptr_World[4])(world);
  this->state_ = (State *)CONCAT44(extraout_var,iVar2);
  this->target_finish_time_ = target_finish_time;
  if ((target_finish_time != -1.0) || (NAN(target_finish_time))) {
    dVar1 = get_time_second();
    EvalLog::allocated_time = (target_finish_time - dVar1) / (double)num_steps;
    EvalLog::curr_inst_remaining_steps = num_steps;
    Globals::config = EvalLog::allocated_time;
  }
  return;
}

Assistant:

Logger::Logger(DSPOMDP* model, Belief* belief, Solver* solver,
		World* world, string world_type, clock_t start_clockt, ostream* out,
		double target_finish_time, int num_steps) :
		model_(model), world_(world), belief_(belief), start_clockt_(
				start_clockt), world_type_(world_type), step_(0), out_(out), reward_(
				0), total_discounted_reward_(0), total_undiscounted_reward_(0) {
	state_ = world->GetCurrentState();
	target_finish_time_ = target_finish_time;
	if (target_finish_time_ != -1) {
		EvalLog::allocated_time = (target_finish_time_ - get_time_second())
				/ num_steps;
		Globals::config.time_per_move = EvalLog::allocated_time;
		EvalLog::curr_inst_remaining_steps = num_steps;
	}
}